

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderDNA.h
# Opt level: O0

void __thiscall Assimp::Blender::FileDatabase::FileDatabase(FileDatabase *this)

{
  FileDatabase *this_local;
  
  DNA::DNA(&this->dna);
  ::std::shared_ptr<Assimp::StreamReader<true,_true>_>::shared_ptr(&this->reader);
  vector<Assimp::Blender::FileBlockHead>::vector(&this->entries);
  Statistics::Statistics(&this->_stats);
  ObjectCache<Assimp::Blender::vector>::ObjectCache
            ((ObjectCache<Assimp::Blender::vector> *)&this->field_0xb8,this);
  ObjectCache<std::shared_ptr>::ObjectCache(&this->_cache,this);
  this->next_cache_idx = 0;
  return;
}

Assistant:

FileDatabase()
        : _cacheArrays(*this)
        , _cache(*this)
        , next_cache_idx()
    {}